

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O3

JavascriptString * __thiscall Js::ScriptFunction::EnsureSourceString(ScriptFunction *this)

{
  ScriptContext *scriptContext;
  Utf8SourceInfo *pUVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  FunctionProxy *this_00;
  ParseableFunctionInfo *this_01;
  JavascriptString *sourceString;
  undefined4 *puVar6;
  LPCUTF8 puVar7;
  uint *puVar8;
  char16 *pcVar9;
  WritableString *pWVar10;
  Recycler *this_02;
  char16 *src;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  undefined1 local_80 [8];
  TrackAllocData data;
  LPCUTF8 pbStart;
  BufferStringBuilder local_48;
  BufferStringBuilder builder;
  ulong local_38;
  
  this_00 = GetFunctionProxy(this);
  this_01 = FunctionProxy::EnsureDeserialized(this_00);
  sourceString = ParseableFunctionInfo::GetCachedSourceString(this_01);
  if (sourceString == (JavascriptString *)0x0) {
    scriptContext =
         (((((this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
             super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
         .scriptContext.ptr;
    pUVar1 = (this_01->super_FunctionProxy).m_utf8SourceInfo.ptr;
    if (((pUVar1 == (Utf8SourceInfo *)0x0) || ((pUVar1->field_0xa8 & 4) == 0)) &&
       (((this_01->super_FunctionProxy).field_0x46 & 8) == 0)) {
      if (((pUVar1->field_0xa8 & 8) == 0) &&
         (((pUVar1->field_0xa8 & 0x10) == 0 ||
          (scriptContext->threadContext->hasUnhandledException == false)))) {
        builder.m_string = (WritableString *)(ulong)this_01->m_cchLength;
        uVar11 = this_01->m_cbLength;
        local_38 = (ulong)uVar11;
        puVar7 = ParseableFunctionInfo::GetToStringSource
                           (this_01,L"ScriptFunction::EnsureSourceString");
        data._32_8_ = puVar7;
        puVar8 = (uint *)FunctionProxy::GetAuxPtr(&this_01->super_FunctionProxy,PrintOffsets);
        if (puVar8 == (uint *)0x0) {
          uVar12 = 0;
        }
        else {
          uVar13 = puVar8[1] - *puVar8;
          if (uVar13 < uVar11) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                        ,0x182,
                                        "((printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) >= cbLength)"
                                        ,
                                        "(printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) >= cbLength"
                                       );
            if (!bVar3) goto LAB_00d48162;
            *puVar6 = 0;
            uVar13 = puVar8[1] - *puVar8;
          }
          uVar4 = ParseableFunctionInfo::StartOffset(this_01);
          uVar11 = *puVar8;
          if (uVar4 < uVar11) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                        ,0x185,
                                        "(pFuncBody->StartOffset() >= printOffsets->cbStartPrintOffset)"
                                        ,
                                        "pFuncBody->StartOffset() >= printOffsets->cbStartPrintOffset"
                                       );
            if (!bVar3) goto LAB_00d48162;
            *puVar6 = 0;
            uVar11 = *puVar8;
          }
          uVar12 = uVar13 - local_38;
          local_38 = (ulong)(puVar8[1] - uVar11);
          if (0x7ffffffd < uVar12) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                        ,0x188,"(cbPreludeLength < MaxCharCount)",
                                        "cbPreludeLength < MaxCharCount");
            if (!bVar3) goto LAB_00d48162;
            *puVar6 = 0;
          }
        }
        uVar13 = (int)uVar12 + (int)builder.m_string;
        local_48.m_string = BufferStringBuilder::WritableString::New(uVar13,scriptContext);
        uVar11 = *(uint *)&((this_01->super_FunctionProxy).m_utf8SourceInfo.ptr)->field_0xa8;
        BufferStringBuilder::DbgAssertNotFrozen(&local_48);
        pcVar9 = JavascriptString::UnsafeGetBuffer(&(local_48.m_string)->super_JavascriptString);
        pWVar10 = (WritableString *)
                  utf8::DecodeUnitsInto
                            (pcVar9,(LPCUTF8 *)&data.line,puVar7 + local_38,
                             uVar11 >> 1 & doAllowThreeByteSurrogates,(bool *)0x0);
        if (pWVar10 < builder.m_string) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                      ,0x194,"(false)",
                                      "Decoded incorrect number of characters for function body");
          if (bVar3) {
            *puVar6 = 0;
            Throw::FatalInternalError(-0x7fffbffb);
          }
          goto LAB_00d48162;
        }
        if (pWVar10 < (WritableString *)(ulong)uVar13) {
          data.plusSize =
               (long)&(pWVar10->super_JavascriptString).super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject + 1;
          local_80 = (undefined1  [8])&char16_t::typeinfo;
          data.typeinfo = (type_info *)0x0;
          data.count = (size_t)anon_var_dwarf_8d953b6;
          data.filename._0_4_ = 0x19b;
          this_02 = Memory::Recycler::TrackAllocInfo
                              (scriptContext->recycler,(TrackAllocData *)local_80);
          BVar5 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar5 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                        "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar3) goto LAB_00d48162;
            *puVar6 = 0;
          }
          pcVar9 = (char16 *)
                   Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                             (this_02,(long)pWVar10 * 2 + 2);
          if (pcVar9 == (char16 *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar3) goto LAB_00d48162;
            *puVar6 = 0;
          }
          BufferStringBuilder::DbgAssertNotFrozen(&local_48);
          src = JavascriptString::UnsafeGetBuffer(&(local_48.m_string)->super_JavascriptString);
          memcpy_s(pcVar9,(long)pWVar10 * 2,src,(long)pWVar10 * 2);
          pcVar9[(long)pWVar10] = L'\0';
          sourceString = JavascriptString::NewWithBuffer(pcVar9,(charcount_t)pWVar10,scriptContext);
        }
        else {
          sourceString = BufferStringBuilder::ToString(&local_48);
        }
      }
      else {
        sourceString = StringCache::GetXDomainFunctionDisplay
                                 (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                                   stringCache);
      }
    }
    else {
      local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffff00000000);
      pcVar9 = FunctionProxy::GetShortDisplayName
                         (&this_01->super_FunctionProxy,(charcount_t *)local_80);
      sourceString = JavascriptFunction::GetLibraryCodeDisplayString(scriptContext,pcVar9);
    }
    if (sourceString == (JavascriptString *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                  ,0x1aa,"(cachedSourceString != nullptr)",
                                  "cachedSourceString != nullptr");
      if (!bVar3) {
LAB_00d48162:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    ParseableFunctionInfo::SetCachedSourceString(this_01,sourceString);
  }
  return sourceString;
}

Assistant:

JavascriptString * ScriptFunction::EnsureSourceString()
    {
        // The function may be defer serialize, need to be deserialized
        FunctionProxy* proxy = this->GetFunctionProxy();
        ParseableFunctionInfo * pFuncBody = proxy->EnsureDeserialized();
        JavascriptString * cachedSourceString = pFuncBody->GetCachedSourceString();
        if (cachedSourceString != nullptr)
        {
            return cachedSourceString;
        }

        ScriptContext * scriptContext = this->GetScriptContext();

        //Library code should behave the same way as RuntimeFunctions
        Utf8SourceInfo* source = pFuncBody->GetUtf8SourceInfo();
        if ((source != nullptr && source->GetIsLibraryCode())
#ifdef ENABLE_WASM
            || (pFuncBody->IsWasmFunction())
#endif
            )
        {
            //Don't display if it is anonymous function
            charcount_t displayNameLength = 0;
            PCWSTR displayName = pFuncBody->GetShortDisplayName(&displayNameLength);
            cachedSourceString = JavascriptFunction::GetLibraryCodeDisplayString(scriptContext, displayName);
        }
        else if (!pFuncBody->GetUtf8SourceInfo()->GetIsXDomain()
            // To avoid backward compat issue, we will not give out sourceString for function if it is called from
            // window.onerror trying to retrieve arguments.callee.caller.
            && !(pFuncBody->GetUtf8SourceInfo()->GetIsXDomainString() && scriptContext->GetThreadContext()->HasUnhandledException())
            )
        {
            // Decode UTF8 into Unicode
            // Consider: Should we have a JavascriptUtf8Substring class which defers decoding
            // until it's needed?

            charcount_t cch = pFuncBody->LengthInChars();
            size_t cbLength = pFuncBody->LengthInBytes();
            LPCUTF8 pbStart = pFuncBody->GetToStringSource(_u("ScriptFunction::EnsureSourceString"));
            size_t cbPreludeLength = 0;
            // cch and cbLength refer to the length of the parse, which may be smaller than the length of the to-string function
            PrintOffsets* printOffsets = pFuncBody->GetPrintOffsets();
            if (printOffsets != nullptr)
            {
                Assert((printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) >= cbLength);
                cbPreludeLength = (printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) - cbLength;

                Assert(pFuncBody->StartOffset() >= printOffsets->cbStartPrintOffset);
                cbLength = printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset;
            }
            Assert(cbPreludeLength < MaxCharCount);
            // the toString of a function may include some prelude, e.g. the computed name expression.
            // We do not store the char-index of the start, but if there are cbPreludeLength bytes difference,
            // then that is an upper bound on the number of characters difference.
            // We also assume that function.toString is relatively infrequent, and non-ascii characters in
            // a prelude are relatively infrequent, so the inaccuracy here should in general be insignificant
            BufferStringBuilder builder(cch + static_cast<charcount_t>(cbPreludeLength), scriptContext);
            utf8::DecodeOptions options = pFuncBody->GetUtf8SourceInfo()->IsCesu8() ? utf8::doAllowThreeByteSurrogates : utf8::doDefault;
            size_t decodedCount = utf8::DecodeUnitsInto(builder.DangerousGetWritableBuffer(), pbStart, pbStart + cbLength, options);

            if (decodedCount < cch)
            {
                AssertMsg(false, "Decoded incorrect number of characters for function body");
                Js::Throw::FatalInternalError();
            }
            else if (decodedCount < cch + static_cast<charcount_t>(cbPreludeLength))
            {
                Recycler* recycler = scriptContext->GetRecycler();

                char16* buffer = RecyclerNewArrayLeaf(recycler, char16, decodedCount + 1);
                wmemcpy_s(buffer, decodedCount, builder.DangerousGetWritableBuffer(), decodedCount);
                buffer[decodedCount] = 0;

                cachedSourceString = JavascriptString::NewWithBuffer(buffer, static_cast<charcount_t>(decodedCount), scriptContext);
            }
            else
            {
                cachedSourceString = builder.ToString();
            }
        }
        else
        {
            cachedSourceString = scriptContext->GetLibrary()->GetXDomainFunctionDisplayString();
        }
        Assert(cachedSourceString != nullptr);
        pFuncBody->SetCachedSourceString(cachedSourceString);
        return cachedSourceString;
    }